

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

GeneratorNode * __thiscall
kratos::GeneratorGraph::add_node(GeneratorGraph *this,Generator *generator)

{
  ulong uVar1;
  Generator *pGVar2;
  mapped_type *pmVar3;
  GeneratorException *this_00;
  ulong uVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  Generator *local_98;
  Generator *local_90;
  undefined1 local_88 [8];
  GeneratorNode node;
  Generator *local_30;
  Generator *generator_local;
  
  uVar1 = (this->nodes_)._M_h._M_bucket_count;
  uVar4 = (ulong)generator % uVar1;
  aVar5 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
           )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              *)((this->nodes_)._M_h._M_buckets + uVar4))->values_;
  aVar6.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  if ((aVar5.values_ !=
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0)
     && (in_R9.values_ =
              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *
              )((aVar5.values_)->field_0).named_args.data, aVar6 = aVar5,
        (Generator *)((in_R9.values_)->field_0).string.size != generator)) {
    while (aVar5 = in_R9,
          in_R9.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)((aVar5.values_)->field_0).named_args.data,
          (named_arg_info<char> *)in_R9.values_ != (named_arg_info<char> *)0x0) {
      pGVar2 = (Generator *)((in_R9.values_)->field_0).string.size;
      aVar6.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           0x0;
      if (((ulong)pGVar2 % uVar1 != uVar4) || (aVar6 = aVar5, pGVar2 == generator))
      goto LAB_001b2dcb;
    }
    aVar6.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  }
LAB_001b2dcb:
  local_30 = generator;
  if ((aVar6.values_ !=
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0)
     && ((_Hash_node_base *)((aVar6.values_)->field_0).long_long_value != (_Hash_node_base *)0x0)) {
    this_00 = (GeneratorException *)__cxa_allocate_exception(0x10);
    node.children._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)(local_30->instance_name)._M_dataplus._M_p;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x22;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&node.children._M_t._M_impl.super__Rb_tree_header._M_node_count;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_88,(detail *)"{0} was used in another generator!",format_str,args);
    local_98 = local_30;
    pmVar3 = std::__detail::
             _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this,&local_30);
    local_90 = pmVar3->generator;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_98;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
               &node.children._M_t._M_impl.super__Rb_tree_header._M_node_count,__l,
               (allocator_type *)((long)&generator_local + 7));
    GeneratorException::GeneratorException
              (this_00,(string *)local_88,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
               &node.children._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __cxa_throw(this_00,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
  }
  node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&node.children;
  local_88 = (undefined1  [8])0x0;
  node.children._M_t._M_impl._0_4_ = 0;
  node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  node.parent = (GeneratorNode *)generator;
  node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       node.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::
  _Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,kratos::GeneratorNode>,std::allocator<std::pair<kratos::Generator*const,kratos::GeneratorNode>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<kratos::Generator*&,kratos::GeneratorNode&>
            ((_Hashtable<kratos::Generator*,std::pair<kratos::Generator*const,kratos::GeneratorNode>,std::allocator<std::pair<kratos::Generator*const,kratos::GeneratorNode>>,std::__detail::_Select1st,std::equal_to<kratos::Generator*>,std::hash<kratos::Generator*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)this,&local_30,local_88);
  pmVar3 = std::__detail::
           _Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<kratos::Generator_*,_std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)this,&local_30);
  std::
  _Rb_tree<kratos::Generator_*,_kratos::Generator_*,_std::_Identity<kratos::Generator_*>,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  ::~_Rb_tree((_Rb_tree<kratos::Generator_*,_kratos::Generator_*,_std::_Identity<kratos::Generator_*>,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
               *)&node.generator);
  return pmVar3;
}

Assistant:

GeneratorNode *GeneratorGraph::add_node(Generator *generator) {
    if (nodes_.find(generator) != nodes_.end()) {
        throw GeneratorException(
            ::format("{0} was used in another generator!", generator->instance_name),
            {generator, nodes_.at(generator).generator});
    }
    GeneratorNode node;
    node.generator = generator;
    nodes_.emplace(generator, node);
    // return the pointer hosted by the nodes_
    return &nodes_.at(generator);
}